

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O2

bool __thiscall
dtc::text_input_buffer::consume_integer_expression
          (text_input_buffer *this,unsigned_long_long *outInt)

{
  byte bVar1;
  bool bVar2;
  __buckets_ptr in_RAX;
  pointer *__ptr;
  undefined1 auVar3 [16];
  __buckets_ptr local_28;
  
  local_28 = in_RAX;
  bVar1 = operator*(this);
  if (bVar1 - 0x30 < 10) {
    bVar2 = consume_integer(this,outInt);
    return bVar2;
  }
  if (bVar1 == 0x28) {
    parse_expression((text_input_buffer *)&stack0xffffffffffffffd8,SUB81(this,0));
    if (local_28 != (__buckets_ptr)0x0) {
      auVar3 = (*(code *)(*local_28)->_M_nxt)(local_28);
      bVar1 = auVar3[8];
      if ((auVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *outInt = auVar3._0_8_;
      }
      (*(code *)(*local_28)[3]._M_nxt)(local_28);
      goto LAB_0013b051;
    }
  }
  bVar1 = 0;
LAB_0013b051:
  return (bool)(bVar1 & 1);
}

Assistant:

bool
text_input_buffer::consume_integer_expression(unsigned long long &outInt)
{
	switch (*(*this))
	{
		case '(':
		{
			expression_ptr e(parse_expression(true));
			if (!e)
			{
				return false;
			}
			auto r = (*e)();
			if (r.second)
			{
				outInt = r.first;
				return true;
			}
			return false;
		}
		case '0'...'9':
			return consume_integer(outInt);
		default:
			return false;
	}
}